

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall
CodeGenGenericContext::MemWrite(CodeGenGenericContext *this,x86Argument *address,x86Argument *value)

{
  anon_union_8_6_73be8994_for_x86Argument_2 aVar1;
  x86Reg xVar2;
  int iVar3;
  int iVar4;
  ArgType AVar5;
  undefined4 uVar6;
  uint uVar7;
  MemCache *pMVar8;
  
  MemInvalidate(this,address);
  uVar7 = MemFind(this,address);
  if (uVar7 == 0) {
    if (this->memCacheFreeSlotCount == 0) {
      uVar7 = this->memCacheNextSlot;
      this->memCacheNextSlot = uVar7 + 1;
      uVar7 = uVar7 & 0xf;
    }
    else {
      uVar7 = this->memCacheFreeSlotCount - 1;
      this->memCacheFreeSlotCount = uVar7;
      uVar7 = this->memCacheFreeSlots[uVar7];
    }
    pMVar8 = this->memCache + uVar7;
    AVar5 = address->type;
    uVar6 = *(undefined4 *)&address->field_0x4;
    aVar1 = address->field_1;
    xVar2 = address->ptrIndex;
    iVar3 = address->ptrMult;
    iVar4 = address->ptrNum;
    this->memCache[uVar7].address.ptrBase = address->ptrBase;
    this->memCache[uVar7].address.ptrIndex = xVar2;
    this->memCache[uVar7].address.ptrMult = iVar3;
    this->memCache[uVar7].address.ptrNum = iVar4;
    (pMVar8->address).type = AVar5;
    *(undefined4 *)&(pMVar8->address).field_0x4 = uVar6;
    this->memCache[uVar7].address.field_1 = aVar1;
  }
  else {
    pMVar8 = this->memCache + (uVar7 - 1);
  }
  AVar5 = value->type;
  uVar6 = *(undefined4 *)&value->field_0x4;
  aVar1 = value->field_1;
  xVar2 = value->ptrIndex;
  iVar3 = value->ptrMult;
  iVar4 = value->ptrNum;
  (pMVar8->value).ptrBase = value->ptrBase;
  (pMVar8->value).ptrIndex = xVar2;
  (pMVar8->value).ptrMult = iVar3;
  (pMVar8->value).ptrNum = iVar4;
  (pMVar8->value).type = AVar5;
  *(undefined4 *)&(pMVar8->value).field_0x4 = uVar6;
  (pMVar8->value).field_1 = aVar1;
  pMVar8->location = (int)((ulong)((long)this->x86Op - (long)this->x86Base) >> 4) * -0x33333333;
  pMVar8->read = false;
  return;
}

Assistant:

void CodeGenGenericContext::MemWrite(const x86Argument &address, const x86Argument &value)
{
	MemInvalidate(address);

	if(unsigned index = MemFind(address))
	{
		index--;

		memCache[index].value = value;
		memCache[index].location = unsigned(x86Op - x86Base);
		memCache[index].read = false;
	}
	else
	{
		unsigned newIndex = 0;

		if(memCacheFreeSlotCount)
			newIndex = memCacheFreeSlots[--memCacheFreeSlotCount];
		else
			newIndex = memCacheNextSlot++ % memoryStateSize;

		memCache[newIndex].address = address;
		memCache[newIndex].value = value;
		memCache[newIndex].location = unsigned(x86Op - x86Base);
		memCache[newIndex].read = false;
	}
}